

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_highbd_dist_wtd_convolve_x_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params,
               int bd)

{
  ushort uVar1;
  int iVar2;
  int16_t *piVar3;
  CONV_BUF_TYPE *pCVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  byte bVar8;
  uint16_t uVar9;
  int iVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  uint16_t *puVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  
  cVar7 = (char)conv_params->round_1;
  bVar8 = (byte)conv_params->round_0;
  cVar6 = cVar7 + bVar8;
  cVar5 = (char)bd - cVar6;
  iVar20 = (1 << (cVar5 + 0xdU & 0x1f)) + (1 << (cVar5 + 0xeU & 0x1f));
  bVar12 = 0xe - cVar6;
  uVar1 = filter_params_x->taps;
  piVar3 = filter_params_x->filter_ptr;
  uVar15 = 0;
  if (w < 1) {
    w = 0;
  }
  uVar19 = (ulong)(uint)h;
  if (h < 1) {
    uVar19 = 0;
  }
  iVar16 = 1 - (uint)(uVar1 >> 1);
  pCVar4 = conv_params->dst;
  iVar2 = conv_params->dst_stride;
  for (; uVar15 != uVar19; uVar15 = uVar15 + 1) {
    iVar17 = iVar16;
    for (uVar21 = 0; uVar21 != (uint)w; uVar21 = uVar21 + 1) {
      iVar10 = 0;
      for (uVar18 = 0; filter_params_x->taps != uVar18; uVar18 = uVar18 + 1) {
        iVar10 = iVar10 + (uint)src[(long)iVar17 + uVar18] *
                          (int)*(short *)((long)piVar3 +
                                         uVar18 * 2 +
                                         (ulong)((subpel_x_qn & 0xfU) * (uint)uVar1 * 2));
      }
      uVar11 = ((iVar10 + ((1 << (bVar8 & 0x1f)) >> 1) >> (bVar8 & 0x1f)) << (7U - cVar7 & 0x1f)) +
               iVar20;
      puVar14 = pCVar4 + uVar15 * (long)iVar2;
      if (conv_params->do_average != 0) {
        uVar13 = (uint)(pCVar4 + uVar15 * (long)iVar2)[uVar21];
        if (conv_params->use_dist_wtd_comp_avg == 0) {
          iVar10 = (int)(uVar11 + uVar13) >> 1;
        }
        else {
          iVar10 = (int)(uVar11 * conv_params->bck_offset + uVar13 * conv_params->fwd_offset) >> 4;
        }
        uVar9 = clip_pixel_highbd(iVar10 + (((1 << (bVar12 & 0x1f)) >> 1) - iVar20) >>
                                  (bVar12 & 0x1f),bd);
        uVar11 = (uint)uVar9;
        puVar14 = dst + uVar15 * (long)dst_stride;
      }
      puVar14[uVar21] = (uint16_t)uVar11;
      iVar17 = iVar17 + 1;
    }
    iVar16 = iVar16 + src_stride;
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_x_c(const uint16_t *src, int src_stride,
                                      uint16_t *dst, int dst_stride, int w,
                                      int h,
                                      const InterpFilterParams *filter_params_x,
                                      const int subpel_x_qn,
                                      ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  int dst16_stride = conv_params->dst_stride;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  const int round_offset = (1 << (offset_bits - conv_params->round_1)) +
                           (1 << (offset_bits - conv_params->round_1 - 1));
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  assert(round_bits >= 0);
  assert(bits >= 0);
  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);
  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = (1 << bits) * ROUND_POWER_OF_TWO(res, conv_params->round_0);
      res += round_offset;

      if (conv_params->do_average) {
        int32_t tmp = dst16[y * dst16_stride + x];
        if (conv_params->use_dist_wtd_comp_avg) {
          tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
          tmp = tmp >> DIST_PRECISION_BITS;
        } else {
          tmp += res;
          tmp = tmp >> 1;
        }
        tmp -= round_offset;
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, round_bits), bd);
      } else {
        dst16[y * dst16_stride + x] = res;
      }
    }
  }
}